

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlpperf.c
# Opt level: O0

void benchmark(tlpperf *t)

{
  int iVar1;
  __sighandler_t p_Var2;
  long lVar3;
  undefined4 *in_RDI;
  tlpperf_thread *th;
  tlpperf_thread ths [16];
  pthread_t ctid;
  int n;
  nettlp *in_stack_fffffffffffffa58;
  pthread_t local_598 [2];
  undefined4 auStack_588 [2];
  undefined2 uStack_580;
  undefined1 auStack_57e [14];
  uint auStack_570 [2];
  ulong auStack_568 [4];
  undefined4 auStack_548 [332];
  pthread_t local_18;
  uint local_c;
  undefined4 *local_8;
  
  local_8 = in_RDI;
  iVar1 = pthread_create(&local_18,(pthread_attr_t *)0x0,count_thread,local_598);
  if (iVar1 < 0) {
    fprintf(_stderr,"%s:ERR: failed to create count thread\n","benchmark");
    perror("pthread_create");
    exit(-1);
  }
  memset(local_598,0,0x580);
  local_c = 0;
  while( true ) {
    if ((int)local_8[10] <= (int)local_c) {
      p_Var2 = signal(2,stop_all);
      if (p_Var2 == (__sighandler_t)0xffffffffffffffff) {
        perror("cannot set seginal\n");
      }
      else {
        for (local_c = 0; (int)local_c < (int)local_8[10]; local_c = local_c + 1) {
          pthread_join(local_598[(long)(int)local_c * 0xb + 1],(void **)0x0);
        }
        pthread_join(local_18,(void **)0x0);
      }
      return;
    }
    lVar3 = (long)(int)local_c;
    local_598[lVar3 * 0xb] = (pthread_t)local_8;
    auStack_588[lVar3 * 0x16] = *local_8;
    auStack_588[lVar3 * 0x16 + 1] = local_8[1];
    (&uStack_580)[lVar3 * 0x2c] = *(undefined2 *)(local_8 + 2);
    auStack_57e[lVar3 * 0x58] = (char)local_c;
    iVar1 = nettlp_init(in_stack_fffffffffffffa58);
    if (iVar1 < 0) {
      perror("nettlp_init");
      return;
    }
    auStack_570[lVar3 * 0x16] = local_c;
    auStack_548[lVar3 * 0x16] = local_8[0xe];
    if (local_8[0xb] == 0) {
      auStack_568[lVar3 * 0xb] = *(ulong *)(local_8 + 4);
      auStack_568[lVar3 * 0xb + 1] = *(ulong *)(local_8 + 6);
    }
    else {
      if (local_8[0xb] != 1) {
        fprintf(_stderr,"%s:ERR: invalid region split pattern\n","benchmark");
        return;
      }
      auStack_568[lVar3 * 0xb] =
           *(long *)(local_8 + 4) +
           (*(ulong *)(local_8 + 6) / (ulong)(long)(int)local_8[10]) * (long)(int)local_c &
           0xfffffffffffff000;
      auStack_568[lVar3 * 0xb + 1] = *(ulong *)(local_8 + 6) / (ulong)(long)(int)local_8[10];
    }
    iVar1 = pthread_create(local_598 + lVar3 * 0xb + 1,(pthread_attr_t *)0x0,benchmark_thread,
                           local_598 + lVar3 * 0xb);
    if (iVar1 < 0) break;
    usleep(0x14);
    local_c = local_c + 1;
  }
  fprintf(_stderr,"%s:ERR: failed to create thread for cpu %d\n","benchmark",(ulong)local_c);
  perror("pthread_create");
  return;
}

Assistant:

void benchmark(struct tlpperf *t)
{
	int n;
	pthread_t ctid;	/* count_thread tid */
	struct tlpperf_thread ths[MAX_CPUS];

	if (pthread_create(&ctid, NULL, count_thread, ths) < 0) {
		pr_err("failed to create count thread\n");
		perror("pthread_create");
		exit(-1);
	}

	memset(ths, 0, sizeof(ths));

	for (n = 0; n < t->nthreads; n++) {
		struct tlpperf_thread *th = &ths[n];

		th->t = t;

		/* initialize nettlp for this thread */
		th->nt.remote_addr = t->remote;
		th->nt.local_addr = t->local;
		th->nt.requester = t->requester;
		th->nt.tag = n;	/* XXX */
		if (nettlp_init(&th->nt) < 0) {
			perror("nettlp_init");
			return;
		}

		/* fill the thread-specific parameters */
		th->cpu = n;	/* XXX */
		th->count = t->count;
		if (t->split == DMA_REGION_SPLIT_SAME) {
			th->region_addr = t->region_addr;
			th->region_size = t->region_size;
		} else if (t->split == DMA_REGION_SPLIT_DIFF) {
			th->region_addr = ((t->region_addr +
					    t->region_size / t->nthreads * n)
					   >> 12) << 12; /* 4k-byte align */
			th->region_size = t->region_size / t->nthreads;
		} else {
			pr_err("invalid region split pattern\n");
			return;
		}
		
		if (pthread_create(&th->tid, NULL, benchmark_thread, th) < 0) {
			pr_err("failed to create thread for cpu %d\n", n);
			perror("pthread_create");
			return;
		}

		usleep(20);	/* to serialize start output on each thread */
	}

	if (signal(SIGINT, stop_all) == SIG_ERR) {
		perror("cannot set seginal\n");
		return;
	}
	
	for (n = 0; n < t->nthreads; n++)
		pthread_join(ths[n].tid, NULL);
		
	pthread_join(ctid, NULL);

	return;
}